

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O3

void __thiscall
DCanvas::VirtualToRealCoords
          (DCanvas *this,double *x,double *y,double *w,double *h,double vwidth,double vheight,
          bool vbottom,bool handleaspect)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  if (handleaspect) {
    fVar8 = ActiveRatio(this->Width,this->Height,(float *)0x0);
  }
  else {
    fVar8 = 1.3333334;
  }
  fVar8 = (float)(~-(uint)(1.7 < fVar8) & (uint)fVar8 | -(uint)(1.7 < fVar8) & 0x3fe38e39);
  dVar9 = *x;
  dVar1 = *w;
  dVar2 = *y;
  dVar3 = *h;
  if (fVar8 <= 1.334) {
    auVar10._0_8_ = (double)this->Width * (dVar1 + dVar9);
    auVar10._8_8_ = (double)this->Width * dVar9;
    auVar13._8_4_ = SUB84(vwidth,0);
    auVar13._0_8_ = vwidth;
    auVar13._12_4_ = (int)((ulong)vwidth >> 0x20);
    auVar13 = divpd(auVar10,auVar13);
    *x = auVar13._8_8_;
    dVar9 = auVar13._0_8_ - auVar13._8_8_;
  }
  else {
    iVar6 = this->Width;
    iVar5 = AspectBaseWidth(fVar8);
    iVar7 = this->Width;
    *x = (double)iVar7 * 0.5 +
         ((double)iVar6 * (dVar9 - vwidth * 0.5) * 960.0) / ((double)iVar5 * vwidth);
    iVar6 = AspectBaseWidth(fVar8);
    dVar9 = ((double)this->Width * 0.5 +
            (((dVar1 + dVar9) - vwidth * 0.5) * (double)iVar7 * 960.0) / ((double)iVar6 * vwidth)) -
            *x;
  }
  *w = dVar9;
  bVar4 = AspectTallerThanWide(fVar8);
  dVar9 = *y;
  if (bVar4) {
    iVar6 = this->Height;
    iVar5 = AspectBaseHeight(fVar8);
    iVar7 = this->Height;
    *y = (double)iVar7 * 0.5 +
         ((double)iVar6 * (dVar9 - vheight * 0.5) * 600.0) / ((double)iVar5 * vheight);
    iVar5 = AspectBaseHeight(fVar8);
    iVar6 = this->Height;
    dVar9 = (double)iVar6;
    *h = (dVar9 * 0.5 +
         (((dVar2 + dVar3) - vheight * 0.5) * (double)iVar7 * 600.0) / ((double)iVar5 * vheight)) -
         *y;
    if (vbottom) {
      iVar7 = AspectMultiplier(fVar8);
      *y = (dVar9 + (double)(iVar7 * iVar6) / -48.0) * 0.5 + *y;
    }
  }
  else {
    auVar12._0_8_ = (double)this->Height * (dVar2 + dVar3);
    auVar12._8_8_ = (double)this->Height * dVar9;
    auVar11._8_8_ = vheight;
    auVar11._0_8_ = vheight;
    auVar13 = divpd(auVar12,auVar11);
    *y = auVar13._8_8_;
    *h = auVar13._0_8_ - auVar13._8_8_;
  }
  return;
}

Assistant:

void DCanvas::VirtualToRealCoords(double &x, double &y, double &w, double &h,
	double vwidth, double vheight, bool vbottom, bool handleaspect) const
{
	float myratio = handleaspect ? ActiveRatio (Width, Height) : (4.0f / 3.0f);

    // if 21:9 AR, map to 16:9 for all callers.
    // this allows for black bars and stops the stretching of fullscreen images
    if (myratio > 1.7f) {
        myratio = 16.0f / 9.0f;
    }

	double right = x + w;
	double bottom = y + h;

	if (myratio > 1.334f)
	{ // The target surface is either 16:9 or 16:10, so expand the
	  // specified virtual size to avoid undesired stretching of the
	  // image. Does not handle non-4:3 virtual sizes. I'll worry about
	  // those if somebody expresses a desire to use them.
		x = (x - vwidth * 0.5) * Width * 960 / (vwidth * AspectBaseWidth(myratio)) + Width * 0.5;
		w = (right - vwidth * 0.5) * Width * 960 / (vwidth * AspectBaseWidth(myratio)) + Width * 0.5 - x;
	}
	else
	{
		x = x * Width / vwidth;
		w = right * Width / vwidth - x;
	}
	if (AspectTallerThanWide(myratio))
	{ // The target surface is 5:4
		y = (y - vheight * 0.5) * Height * 600 / (vheight * AspectBaseHeight(myratio)) + Height * 0.5;
		h = (bottom - vheight * 0.5) * Height * 600 / (vheight * AspectBaseHeight(myratio)) + Height * 0.5 - y;
		if (vbottom)
		{
			y += (Height - Height * AspectMultiplier(myratio) / 48.0) * 0.5;
		}
	}
	else
	{
		y = y * Height / vheight;
		h = bottom * Height / vheight - y;
	}
}